

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::processOrder(Application *this,Order *order)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  reference order_00;
  string local_88;
  undefined1 local_68 [8];
  queue<Order,_std::deque<Order,_std::allocator<Order>_>_> orders;
  Order *order_local;
  Application *this_local;
  
  orders.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = (_Map_pointer)order;
  bVar1 = OrderMatcher::insert(&this->m_orderMatcher,order);
  if (bVar1) {
    acceptOrder(this,(Order *)orders.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node);
    std::queue<Order,std::deque<Order,std::allocator<Order>>>::
    queue<std::deque<Order,std::allocator<Order>>,void>
              ((queue<Order,std::deque<Order,std::allocator<Order>>> *)local_68);
    psVar2 = Order::getSymbol_abi_cxx11_
                       ((Order *)orders.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar2);
    OrderMatcher::match(&this->m_orderMatcher,&local_88,
                        (queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *)local_68);
    std::__cxx11::string::~string((string *)&local_88);
    while( true ) {
      sVar3 = std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::size
                        ((queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *)local_68);
      if (sVar3 == 0) break;
      order_00 = std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::front
                           ((queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *)local_68);
      fillOrder(this,order_00);
      std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::pop
                ((queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *)local_68);
    }
    std::queue<Order,_std::deque<Order,_std::allocator<Order>_>_>::~queue
              ((queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *)local_68);
  }
  else {
    rejectOrder(this,(Order *)orders.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node);
  }
  return;
}

Assistant:

void Application::processOrder(const Order &order) {
  if (m_orderMatcher.insert(order)) {
    acceptOrder(order);

    std::queue<Order> orders;
    m_orderMatcher.match(order.getSymbol(), orders);

    while (orders.size()) {
      fillOrder(orders.front());
      orders.pop();
    }
  } else {
    rejectOrder(order);
  }
}